

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O0

void xm_autovibrato(xm_context_t *ctx,xm_channel_context_t *ch)

{
  ushort uVar1;
  uint uVar2;
  long in_RSI;
  float fVar3;
  uint step;
  float sweep;
  xm_instrument_t *instr;
  xm_channel_context_t *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  float fVar4;
  long lVar5;
  
  if ((*(long *)(in_RSI + 8) == 0) || (*(char *)(*(long *)(in_RSI + 8) + 0xd9) == '\0')) {
    if ((*(float *)(in_RSI + 0x50) != 0.0) || (NAN(*(float *)(in_RSI + 0x50)))) {
      *(undefined4 *)(in_RSI + 0x50) = 0;
      xm_update_frequency((xm_context_t *)
                          CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffd8);
    }
  }
  else {
    lVar5 = *(long *)(in_RSI + 8);
    fVar4 = 1.0;
    if (*(ushort *)(in_RSI + 0x3c) < (ushort)*(byte *)(lVar5 + 0xd8)) {
      fVar4 = (float)*(ushort *)(in_RSI + 0x3c) / (float)*(byte *)(lVar5 + 0xd8) + 0.0;
    }
    uVar1 = *(ushort *)(in_RSI + 0x3c);
    *(ushort *)(in_RSI + 0x3c) = uVar1 + 1;
    uVar2 = (uint)uVar1 * (uint)*(byte *)(lVar5 + 0xda) >> 2;
    fVar3 = xm_waveform((xm_waveform_type_t)in_RSI,(uint8_t)((ulong)lVar5 >> 0x38));
    *(float *)(in_RSI + 0x50) = ((fVar3 * 0.25 * (float)*(byte *)(lVar5 + 0xd9)) / 15.0) * fVar4;
    xm_update_frequency((xm_context_t *)CONCAT44(fVar4,uVar2),in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void xm_autovibrato(xm_context_t* ctx, xm_channel_context_t* ch) {
	if(ch->instrument == NULL || ch->instrument->vibrato_depth == 0){
		if (ch->autovibrato_note_offset){
			ch->autovibrato_note_offset = 0.f;
			xm_update_frequency(ctx, ch);
		}
		return;
	}
	xm_instrument_t* instr = ch->instrument;
	float sweep = 1.f;

	if(ch->autovibrato_ticks < instr->vibrato_sweep) {
		/* No idea if this is correct, but it sounds close enough… */
		sweep = XM_LERP(0.f, 1.f, (float)ch->autovibrato_ticks / (float)instr->vibrato_sweep);
	}

	unsigned int step = ((ch->autovibrato_ticks++) * instr->vibrato_rate) >> 2;
	ch->autovibrato_note_offset = .25f * xm_waveform(instr->vibrato_type, step)
		* (float)instr->vibrato_depth / (float)0xF * sweep;
	xm_update_frequency(ctx, ch);
}